

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O3

void __thiscall
duckdb::WindowSegmentTreePart::Finalize(WindowSegmentTreePart *this,Vector *result,idx_t count)

{
  aggregate_destructor_t p_Var1;
  FunctionDataWrapper *pFVar2;
  AggregateObject *pAVar3;
  AggregateInputData aggr_input_data;
  AggregateInputData local_38;
  
  pAVar3 = this->aggr;
  if ((pAVar3->bind_data_wrapper).internal.
      super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_38.bind_data.ptr = (FunctionData *)0x0;
  }
  else {
    pFVar2 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->(&pAVar3->bind_data_wrapper);
    local_38.bind_data.ptr =
         (pFVar2->function_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    pAVar3 = this->aggr;
  }
  local_38.allocator = this->allocator;
  local_38.combine_type = PRESERVE_INPUT;
  (*(pAVar3->function).finalize)(&this->statef,&local_38,result,count,0);
  p_Var1 = (this->aggr->function).destructor;
  if (p_Var1 != (aggregate_destructor_t)0x0) {
    (*p_Var1)(&this->statef,&local_38,count);
  }
  return;
}

Assistant:

void WindowSegmentTreePart::Finalize(Vector &result, idx_t count) {
	//	Finalise the result aggregates and write to result if write_result is set
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	aggr.function.finalize(statef, aggr_input_data, result, count, 0);

	//	Destruct the result aggregates
	if (aggr.function.destructor) {
		aggr.function.destructor(statef, aggr_input_data, count);
	}
}